

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  StatementSyntax *args_2;
  RandCaseItemSyntax *pRVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = (StatementSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RandCaseItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_30,args_2);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RandCaseItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RandCaseItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.colon.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}